

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d.cpp
# Opt level: O2

void * rw::d3d::createTexture(int32 width,int32 height,int32 numlevels,uint32 usage,uint32 format)

{
  uint32 uVar1;
  uint32 uVar2;
  int32 *piVar3;
  undefined8 *puVar4;
  undefined4 in_register_00000014;
  ulong uVar5;
  uint uVar6;
  uint32 width_00;
  uint uVar8;
  int32 *piVar9;
  int iVar10;
  long lVar11;
  bool bVar12;
  uint uVar7;
  
  uVar5 = CONCAT44(in_register_00000014,numlevels);
  iVar10 = 0;
  uVar6 = 0;
  uVar2 = height;
  width_00 = width;
  uVar7 = 0;
  if (0 < numlevels) {
    uVar6 = numlevels;
    uVar7 = numlevels;
  }
  while (bVar12 = uVar6 != 0, uVar6 = uVar6 - 1, bVar12) {
    uVar1 = calculateTextureSize(width_00,uVar2,format,usage);
    iVar10 = iVar10 + uVar1;
    uVar8 = width_00 + 1;
    width_00 = (int)width_00 / 2;
    if (uVar8 < 3) {
      width_00 = 1;
    }
    uVar5 = (long)(int)uVar2 % 2 & 0xffffffff;
    uVar8 = uVar2 + 1;
    uVar2 = (int)uVar2 / 2;
    usage = width_00;
    if (uVar8 < 3) {
      uVar2 = 1;
    }
  }
  puVar4 = &allocLocation;
  allocLocation =
       "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/d3d.cpp line: 231"
  ;
  piVar3 = (int32 *)(*DAT_00145dd8)((long)(numlevels + -1) * 0x18 + (long)iVar10 + 0x20,0x30b00,
                                    uVar5);
  piVar9 = piVar3 + (long)(numlevels + -1) * 6 + 8;
  *piVar3 = numlevels;
  piVar3[1] = format;
  for (lVar11 = 0; (ulong)uVar7 * 0x18 - lVar11 != 0; lVar11 = lVar11 + 0x18) {
    *(int32 *)((long)piVar3 + lVar11 + 8) = width;
    *(int32 *)((long)piVar3 + lVar11 + 0xc) = height;
    *(int32 **)((long)piVar3 + lVar11 + 0x18) = piVar9;
    uVar2 = calculateTextureSize(width,height,format,(uint32)puVar4);
    *(uint32 *)((long)piVar3 + lVar11 + 0x10) = uVar2;
    piVar9 = (int32 *)((long)piVar9 + (long)(int)uVar2);
    uVar5 = (long)width / 2;
    if (width + 1U < 3) {
      uVar5 = 1;
    }
    puVar4 = (undefined8 *)(uVar5 & 0xffffffff);
    uVar2 = height / 2;
    if (height + 1U < 3) {
      uVar2 = 1;
    }
    width = (int32)uVar5;
    height = uVar2;
  }
  return piVar3;
}

Assistant:

void*
createTexture(int32 width, int32 height, int32 numlevels, uint32 usage, uint32 format)
{
#ifdef RW_D3D9
	IDirect3DTexture9 *tex;
	d3ddevice->CreateTexture(width, height, numlevels, usage,
	                      (D3DFORMAT)format, D3DPOOL_MANAGED, &tex, nil);
	if(tex)
		d3d9Globals.numTextures++;
	return tex;
#else
	int32 w = width;
	int32 h = height;
	int32 size = 0;
	for(int32 i = 0; i < numlevels; i++){
		size += calculateTextureSize(w, h, 1, format);
		w /= 2;
		if(w == 0) w = 1;
		h /= 2;
		if(h == 0) h = 1;
	}
	uint8 *data = (uint8*)rwNew(sizeof(RasterLevels)+sizeof(RasterLevels::Level)*(numlevels-1)+size,
		MEMDUR_EVENT | ID_DRIVER);
	RasterLevels *levels = (RasterLevels*)data;
	data += sizeof(RasterLevels)+sizeof(RasterLevels::Level)*(numlevels-1);
	levels->numlevels = numlevels;
	levels->format = format;
	w = width;
	h = height;
	for(int32 i = 0; i < numlevels; i++){
		levels->levels[i].width = w;
		levels->levels[i].height = h;
		levels->levels[i].data = data;
		levels->levels[i].size = calculateTextureSize(w, h, 1, format);
		data += levels->levels[i].size;
		w /= 2;
		if(w == 0) w = 1;
		h /= 2;
		if(h == 0) h = 1;
	}
	return levels;
#endif
}